

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

void __thiscall
SQCompilation::CheckerVisitor::checkMissedBreak(CheckerVisitor *this,SwitchStatement *swtch)

{
  TreeOp TVar1;
  Statement *n;
  long lVar2;
  bool bVar3;
  Statement *pSVar4;
  Node *n_00;
  ulong uVar5;
  long lVar6;
  SwitchCase *pSVar7;
  long lVar8;
  SwitchCase *pSVar9;
  FunctionReturnTypeEvaluator rtEvaluator;
  FunctionReturnTypeEvaluator local_40;
  
  if (this->effectsOnly == false) {
    local_40.flags = 0;
    uVar5 = (ulong)(swtch->_cases)._size;
    local_40.checker = this;
    if (uVar5 == 0) {
      n_00 = (Node *)0x0;
    }
    else {
      pSVar7 = (swtch->_cases)._vals;
      pSVar9 = pSVar7 + uVar5;
      n_00 = (Node *)0x0;
      do {
        if (n_00 != (Node *)0x0) {
          report(this,n_00,0x72);
        }
        n = pSVar7->stmt;
        local_40.flags = 0;
        bVar3 = FunctionReturnTypeEvaluator::checkNode(&local_40,n);
        if (bVar3) {
LAB_0015503a:
          n_00 = (Node *)0x0;
        }
        else {
          local_40.flags = local_40.flags | 1;
          pSVar4 = unwrapBodyNonEmpty(n);
          if (pSVar4 == (Statement *)0x0) goto LAB_0015503a;
          TVar1 = (pSVar4->super_Node)._op;
          if (TVar1 == TO_BLOCK) {
            uVar5 = (ulong)(uint)pSVar4[1].super_Node._coordinates.lineEnd;
            if (uVar5 == 0) {
              lVar6 = 0;
            }
            else {
              lVar8 = 0;
              lVar6 = 0;
              do {
                lVar2 = *(long *)(*(long *)&pSVar4[1].super_Node._coordinates + lVar8);
                if (*(int *)(lVar2 + 0x18) != 0xe) {
                  lVar6 = lVar2;
                }
                lVar8 = lVar8 + 8;
              } while (uVar5 << 3 != lVar8);
            }
            if (lVar6 == 0) goto LAB_0015503a;
            TVar1 = *(TreeOp *)(lVar6 + 0x18);
            n = pSVar4;
          }
          if (TVar1 == TO_BREAK) goto LAB_0015503a;
          n_00 = &unwrapBody(n)->super_Node;
        }
        pSVar7 = pSVar7 + 1;
      } while (pSVar7 != pSVar9);
    }
    if ((n_00 != (Node *)0x0) && ((swtch->_defaultCase).stmt != (Statement *)0x0)) {
      report(this,n_00,0x72);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkMissedBreak(const SwitchStatement *swtch) {
  if (effectsOnly)
    return;

  auto &cases = swtch->cases();

  FunctionReturnTypeEvaluator rtEvaluator(this);

  const Statement *last = nullptr;
  for (auto &c : cases) {

    if (last) {
      report(last, DiagnosticsId::DI_MISSED_BREAK);
    }
    last = nullptr;

    const Statement *stmt = c.stmt;
    bool r = false;
    rtEvaluator.compute(stmt, r);
    if (!r) {
      const Statement *uw = unwrapBodyNonEmpty(stmt);

      if (!uw)
        continue; // empty case statement -> FT

      const enum TreeOp op = uw->op();
      if (op != TO_BLOCK) {
        if (op != TO_BREAK)
          last = unwrapBody(stmt);
      }
      else {
        const Block *b = uw->asBlock();
        int32_t dummy;
        const Statement *tmp = lastNonEmpty(b, dummy);
        if (tmp && tmp->op() != TO_BREAK) {
          last = unwrapBody(b);
        }
      }
    }
  }

  if (last && swtch->defaultCase().stmt) {
    /*
      switch (x) {
        case A:
          ...
          break;

        case B:
          ...   <-- missed break
        default:
          ...
      }
    */
    report(last, DiagnosticsId::DI_MISSED_BREAK);
  }
}